

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::SelectCoins
          (CoinSelection *this,AmountMap *map_target_value,
          vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *utxos,UtxoFilter *filter,
          CoinSelectionOption *option_params,Amount *tx_fee_value,AmountMap *map_select_value,
          Amount *utxo_fee_value,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *map_searched_bnb,AmountMap *map_utxo_fee_value)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  size_type sVar6;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RCX;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RDI;
  undefined4 *in_R8;
  CoinSelectionOption *in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_bool>
  pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>,_bool>
  pVar8;
  undefined8 *in_stack_00000008;
  long in_stack_00000010;
  undefined8 *in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  int64_t target_value_1;
  long *target_value;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *target_1;
  iterator __end1_1;
  iterator __begin1_1;
  AmountMap *__range1_1;
  anon_class_168_9_d2d4f853 coin_selection_function;
  AmountMap work_map_utxo_fee_value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  work_searched_bnb;
  Amount work_utxo_fee;
  AmountMap work_selected_values;
  Amount tx_fee_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_byte;
  Utxo *utxo;
  iterator __end2;
  iterator __begin2;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__range2;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> p_utxos;
  ConfidentialAssetId target_asset;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *target;
  iterator __end1;
  iterator __begin1;
  AmountMap *__range1;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> work_utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
  asset_utxos;
  iterator iter;
  ConfidentialAssetId fee_asset;
  AmountMap work_target_values;
  bool calculate_fee;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *result;
  CoinSelectionOption *in_stack_fffffffffffff8a8;
  CoinSelectionOption *in_stack_fffffffffffff8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8b8;
  Amount *tx_fee;
  CfdSourceLocation *in_stack_fffffffffffff8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8c8;
  CfdError CVar9;
  CfdException *in_stack_fffffffffffff8d0;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff8e0;
  undefined7 in_stack_fffffffffffff8e8;
  undefined1 in_stack_fffffffffffff8ef;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>
  in_stack_fffffffffffff8f0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff8f8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff900;
  allocator *paVar10;
  byte local_631;
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [23];
  undefined1 in_stack_fffffffffffffa27;
  string *in_stack_fffffffffffffa28;
  Amount *in_stack_fffffffffffffa30;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *in_stack_fffffffffffffa38;
  int64_t *in_stack_fffffffffffffa40;
  anon_class_168_9_d2d4f853 *in_stack_fffffffffffffa48;
  string local_5b0 [32];
  reference local_590;
  _Self local_588;
  _Self local_580;
  undefined1 *local_578;
  undefined4 local_568;
  undefined8 *local_4f0;
  undefined1 *local_4e8;
  undefined8 *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  undefined1 local_4c8 [48];
  undefined1 local_498 [48];
  undefined8 local_468;
  undefined1 local_460;
  undefined1 local_458 [48];
  undefined8 local_428;
  undefined8 uStack_420;
  byte local_411;
  _Base_ptr local_410;
  undefined1 local_408;
  undefined1 local_3fa;
  allocator local_3f9;
  string local_3f8 [32];
  char *local_3d8;
  undefined4 local_3d0;
  char *local_3c8;
  reference local_3c0;
  ByteData local_3b8;
  ConfidentialAssetId local_3a0;
  string local_378 [40];
  vector local_350 [24];
  reference local_338;
  Utxo *local_330;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_328;
  undefined1 *local_320;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> local_318;
  undefined1 local_2fa;
  allocator local_2f9;
  string local_2f8 [32];
  char *local_2d8;
  undefined4 local_2d0;
  char *local_2c8;
  ConfidentialAssetId local_2c0;
  reference local_298;
  _Self local_290;
  _Self local_288;
  undefined1 *local_280;
  undefined1 local_278 [72];
  _Base_ptr local_230;
  undefined1 local_228;
  undefined4 local_21c;
  string local_218 [32];
  _Self local_1f8;
  string local_1f0 [32];
  _Self local_1d0;
  ConfidentialAssetId local_1c8;
  ConfidentialAssetId local_1a0;
  undefined1 local_178 [54];
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  char *local_120;
  undefined4 local_118;
  char *local_110;
  undefined1 local_102;
  allocator local_101;
  string local_100 [72];
  string local_b8 [32];
  uint64_t local_98;
  char *local_90;
  undefined4 local_88;
  char *local_80;
  byte local_61;
  byte local_31;
  CoinSelectionOption *local_30;
  undefined4 *local_28;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  uVar4 = CoinSelectionOption::GetEffectiveFeeBaserate(in_R9);
  local_31 = uVar4 != 0;
  local_61 = 0;
  local_631 = 0;
  if ((bool)local_31) {
    CoinSelectionOption::GetFeeAsset(in_stack_fffffffffffff8a8);
    local_61 = 1;
    local_631 = cfd::core::ConfidentialAssetId::IsEmpty();
  }
  if ((local_61 & 1) != 0) {
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x3d8fde);
  }
  if ((local_631 & 1) != 0) {
    local_90 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_utxo.cpp"
                       ,0x2f);
    CVar9 = (CfdError)((ulong)in_stack_fffffffffffff8c8 >> 0x20);
    local_90 = local_90 + 1;
    local_88 = 0x13e;
    local_80 = "SelectCoins";
    local_98 = CoinSelectionOption::GetEffectiveFeeBaserate(local_30);
    CoinSelectionOption::GetFeeAsset(in_stack_fffffffffffff8a8);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    core::logger::warn<unsigned_long,std::__cxx11::string>
              (in_stack_fffffffffffff8c0,(char *)in_stack_fffffffffffff8b8,
               (unsigned_long *)in_stack_fffffffffffff8b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8a8);
    std::__cxx11::string::~string(local_b8);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x3d90ad);
    local_102 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"Failed to SelectCoins. Fee calculation option error.",&local_101);
    core::CfdException::CfdException
              (in_stack_fffffffffffff8d0,CVar9,(string *)in_stack_fffffffffffff8c0);
    local_102 = 0;
    __cxa_throw(uVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (in_stack_00000010 == 0) {
    local_120 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_utxo.cpp"
                        ,0x2f);
    CVar9 = (CfdError)((ulong)in_stack_fffffffffffff8c8 >> 0x20);
    local_120 = local_120 + 1;
    local_118 = 0x148;
    local_110 = "SelectCoins";
    core::logger::warn<>
              ((CfdSourceLocation *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->use_bnb_);
    local_142 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_140,"Failed to SelectCoins. map_select_value is empty.",&local_141);
    core::CfdException::CfdException
              (in_stack_fffffffffffff8d0,CVar9,(string *)in_stack_fffffffffffff8c0);
    local_142 = 0;
    __cxa_throw(uVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)in_stack_fffffffffffff8b0,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)in_stack_fffffffffffff8a8);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1a0);
  if (((local_31 & 1) != 0) && (bVar1 = CoinSelectionOption::HasIgnoreFeeAsset(local_30), !bVar1)) {
    CoinSelectionOption::GetFeeAsset(in_stack_fffffffffffff8a8);
    cfd::core::ConfidentialAssetId::operator=(&local_1a0,&local_1c8);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x3d93f2);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_1d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 *)in_stack_fffffffffffff8a8,(key_type *)0x3d941e);
    std::__cxx11::string::~string(local_1f0);
    local_1f8._M_node =
         (_Base_ptr)
         std::
         end<std::map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>>
                   ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)in_stack_fffffffffffff8a8);
    bVar1 = std::operator==(&local_1d0,&local_1f8);
    if (bVar1) {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      local_21c = 0;
      pVar7 = std::
              map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
              ::emplace<std::__cxx11::string,int>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                         (int *)in_stack_fffffffffffff8b0);
      local_230 = (_Base_ptr)pVar7.first._M_node;
      local_228 = pVar7.second;
      std::__cxx11::string::~string(local_218);
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
         *)0x3d95bd);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  local_280 = local_178;
  local_288._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                *)in_stack_fffffffffffff8a8);
  local_290._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              *)in_stack_fffffffffffff8a8);
  while( true ) {
    bVar1 = std::operator!=(&local_288,&local_290);
    if (!bVar1) {
      local_411 = 0;
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x3d9c9b);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(local_20);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::reserve
                (in_stack_fffffffffffff8e0,
                 CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
      local_428 = *in_stack_00000008;
      uStack_420 = in_stack_00000008[1];
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             *)0x3d9cda);
      cfd::core::Amount::Amount((Amount *)&local_468);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *)0x3d9cf6);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             *)0x3d9d03);
      local_568 = *local_28;
      CoinSelectionOption::CoinSelectionOption(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
      local_4f0 = &local_428;
      local_4e8 = local_458;
      local_4e0 = &local_468;
      local_4d8 = local_498;
      local_4d0 = local_4c8;
      local_578 = local_178;
      local_580._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    *)in_stack_fffffffffffff8a8);
      local_588._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)in_stack_fffffffffffff8a8);
      while (bVar1 = std::operator!=(&local_580,&local_588), bVar1) {
        local_590 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                                 *)0x3d9e00);
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
        std::__cxx11::string::~string(local_5b0);
        if ((bVar3 & 1) == 0) {
          in_stack_fffffffffffff8c8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_590->second;
          in_stack_fffffffffffffa48 = (anon_class_168_9_d2d4f853 *)in_stack_fffffffffffff8c8;
          in_stack_fffffffffffff8d0 =
               (CfdException *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                             *)in_stack_fffffffffffff8f0._M_node,
                            (key_type *)
                            CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
          cfd::core::Amount::Amount((Amount *)&stack0xfffffffffffffa38);
          SelectCoins::anon_class_168_9_d2d4f853::operator()
                    (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                     in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                     (bool)in_stack_fffffffffffffa27);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                      *)in_stack_fffffffffffff8b0);
      }
      if (((local_31 & 1) != 0) &&
         (bVar1 = CoinSelectionOption::HasIgnoreFeeAsset(local_30), !bVar1)) {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        in_stack_fffffffffffff8c0 =
             (CfdSourceLocation *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)in_stack_fffffffffffff8f0._M_node,
                          (key_type *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8))
        ;
        tx_fee = (Amount *)in_stack_fffffffffffff8c0->filename;
        std::__cxx11::string::~string(local_5f0);
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        in_stack_fffffffffffff8b0 =
             (CoinSelectionOption *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                           *)in_stack_fffffffffffff8f0._M_node,
                          (key_type *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8))
        ;
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        SelectCoins::anon_class_168_9_d2d4f853::operator()
                  (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                   tx_fee,in_stack_fffffffffffffa28,(bool)in_stack_fffffffffffffa27);
        std::__cxx11::string::~string(local_630);
        std::__cxx11::string::~string(local_610);
      }
      if (in_stack_00000010 != 0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)in_stack_fffffffffffff8b0,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)in_stack_fffffffffffff8a8);
      }
      if (in_stack_00000018 != (undefined8 *)0x0) {
        *in_stack_00000018 = local_468;
        *(undefined1 *)(in_stack_00000018 + 1) = local_460;
      }
      if (in_stack_00000020 != 0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     *)in_stack_fffffffffffff8b0,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     *)in_stack_fffffffffffff8a8);
      }
      if (in_stack_00000028 != 0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)in_stack_fffffffffffff8b0,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)in_stack_fffffffffffff8a8);
      }
      local_411 = 1;
      SelectCoins(std::map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>const&,std::vector<cfd::Utxo,std::allocator<cfd::Utxo>>const&,cfd::UtxoFilter_const&,cfd::CoinSelectionOption_const&,cfd::core::Amount_const&,std::map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>*,cfd::core::Amount*,std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>*,std::map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>*)
      ::$_0::~__0((anon_class_168_9_d2d4f853 *)0x3da17b);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              *)0x3da188);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)0x3da195);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              *)0x3da1a2);
      if ((local_411 & 1) == 0) {
        std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector
                  ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff8c0);
      }
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector
                ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff8c0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
              *)0x3da20b);
      core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x3da218);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              *)0x3da225);
      return in_RDI;
    }
    local_298 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                             *)0x3d9639);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_2c0,(string *)local_298);
    bVar3 = cfd::core::ConfidentialAssetId::IsEmpty();
    if ((bVar3 & 1) != 0) break;
    std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::vector
              ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)0x3d981d);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(local_20);
    std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::reserve
              ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)in_stack_fffffffffffff8e0,
               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    local_320 = local_278;
    local_328._M_current =
         (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                           ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
                            in_stack_fffffffffffff8a8);
    local_330 = (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::end
                                  ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
                                   in_stack_fffffffffffff8a8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                               *)in_stack_fffffffffffff8b0,
                              (__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                               *)in_stack_fffffffffffff8a8), bVar1) {
      local_338 = __gnu_cxx::
                  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                  ::operator*(&local_328);
      std::begin<unsigned_char,33ul>(&local_338->asset);
      std::end<unsigned_char,33ul>(&local_338->asset);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3d98f0);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffff8f0._M_node,
                 (uchar *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8),
                 (uchar *)in_stack_fffffffffffff8e0,
                 (allocator_type *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3d991e);
      cfd::core::ByteData::ByteData(&local_3b8,local_350);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_3a0,&local_3b8);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      std::__cxx11::string::~string(local_378);
      core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x3d99a0);
      core::ByteData::~ByteData((ByteData *)0x3d99ad);
      if (_Var2) {
        local_3c0 = local_338;
        std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::push_back
                  ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)in_stack_fffffffffffff8b0,
                   (value_type *)in_stack_fffffffffffff8a8);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff8c0)
      ;
      __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
      ::operator++(&local_328);
    }
    sVar6 = std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::size(&local_318);
    if (sVar6 == 0) {
      local_3d8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_utxo.cpp"
                          ,0x2f);
      CVar9 = (CfdError)((ulong)in_stack_fffffffffffff8c8 >> 0x20);
      local_3d8 = local_3d8 + 1;
      local_3d0 = 0x172;
      local_3c8 = "SelectCoins";
      core::logger::warn<std::__cxx11::string_const&>
                ((CfdSourceLocation *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->use_bnb_
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d9b1b);
      local_3fa = 1;
      uVar5 = __cxa_allocate_exception(0x30);
      paVar10 = &local_3f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3f8,"Failed to SelectCoins. Target asset is not found in utxo list.",paVar10)
      ;
      core::CfdException::CfdException
                (in_stack_fffffffffffff8d0,CVar9,(string *)in_stack_fffffffffffff8c0);
      local_3fa = 0;
      __cxa_throw(uVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    pVar8 = std::
            map<std::__cxx11::string,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>>>>
            ::
            emplace<std::__cxx11::string_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>_>_>_>
                        *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                       (vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)
                       in_stack_fffffffffffff8b0);
    in_stack_fffffffffffff8f0 = pVar8.first._M_node;
    in_stack_fffffffffffff8ef = pVar8.second;
    local_410 = in_stack_fffffffffffff8f0._M_node;
    local_408 = in_stack_fffffffffffff8ef;
    std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::~vector
              ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)in_stack_fffffffffffff8c0);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x3d9c55);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                  *)in_stack_fffffffffffff8b0);
  }
  local_2d8 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_utxo.cpp"
                      ,0x2f);
  CVar9 = (CfdError)((ulong)in_stack_fffffffffffff8c8 >> 0x20);
  local_2d8 = local_2d8 + 1;
  local_2d0 = 0x160;
  local_2c8 = "SelectCoins";
  core::logger::warn<>
            ((CfdSourceLocation *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->use_bnb_);
  local_2fa = 1;
  uVar5 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"Failed to SelectCoins. Target asset is empty.",&local_2f9)
  ;
  core::CfdException::CfdException
            (in_stack_fffffffffffff8d0,CVar9,(string *)in_stack_fffffffffffff8c0);
  local_2fa = 0;
  __cxa_throw(uVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::vector<Utxo> CoinSelection::SelectCoins(
    const AmountMap& map_target_value, const std::vector<Utxo>& utxos,
    const UtxoFilter& filter, const CoinSelectionOption& option_params,
    const Amount& tx_fee_value, AmountMap* map_select_value,
    Amount* utxo_fee_value, std::map<std::string, bool>* map_searched_bnb,
    AmountMap* map_utxo_fee_value) {
  bool calculate_fee = (option_params.GetEffectiveFeeBaserate() != 0);
  if (calculate_fee && option_params.GetFeeAsset().IsEmpty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to SelectCoins. Fee calculation option error."
        ": effective_fee_base_rate=[{}], fee_asset=[{}]",
        option_params.GetEffectiveFeeBaserate(),
        option_params.GetFeeAsset().GetHex());
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Failed to SelectCoins. Fee calculation option error.");
  }
  if (map_select_value == nullptr) {
    warn(CFD_LOG_SOURCE, "Failed to SelectCoins. map_select_value is empty.");
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Failed to SelectCoins. map_select_value is empty.");
  }

  // add fee asset to target asset list
  AmountMap work_target_values = map_target_value;
  ConfidentialAssetId fee_asset;
  if (calculate_fee && (!option_params.HasIgnoreFeeAsset())) {
    fee_asset = option_params.GetFeeAsset();
    auto iter = work_target_values.find(fee_asset.GetHex());
    if (iter == std::end(work_target_values)) {
      work_target_values.emplace(fee_asset.GetHex(), 0);
    }
  }

  // asset exists check
  std::map<std::string, std::vector<Utxo*>> asset_utxos;
  std::vector<Utxo> work_utxos = utxos;
  for (auto& target : work_target_values) {
    // asset valid check...
    ConfidentialAssetId target_asset(target.first);
    if (target_asset.IsEmpty()) {
      warn(CFD_LOG_SOURCE, "Failed to SelectCoins. Target asset is empty.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Target asset is empty.");
    }

    // convert utxo list to ptr
    std::vector<Utxo*> p_utxos;
    p_utxos.reserve(utxos.size());
    for (auto& utxo : work_utxos) {
      std::vector<uint8_t> asset_byte(
          std::begin(utxo.asset), std::end(utxo.asset));
      if (target.first == ConfidentialAssetId(asset_byte).GetHex()) {
        p_utxos.push_back(&utxo);
      }
    }
    if (p_utxos.size() == 0) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to SelectCoins. Target asset is not found in utxo list."
          "target_asset=[{}]",
          target.first);
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Target asset is not found in utxo list.");
    }

    asset_utxos.emplace(target.first, p_utxos);
  }

  // coin selection function
  std::vector<Utxo> result;
  result.reserve(utxos.size());
  Amount tx_fee_out = tx_fee_value;
  AmountMap work_selected_values;
  Amount work_utxo_fee = Amount();
  std::map<std::string, bool> work_searched_bnb;
  AmountMap work_map_utxo_fee_value;
  auto coin_selection_function = [this, filter, option_params, &result,
                                  &tx_fee_out, &work_selected_values,
                                  &work_utxo_fee, &work_searched_bnb,
                                  &work_map_utxo_fee_value](
                                     const int64_t& target_value,
                                     const std::vector<Utxo*>& utxos,
                                     const Amount& tx_fee,
                                     const std::string& asset_id,
                                     bool consider_fee) {
    int64_t select_value_out = 0;
    Amount utxo_fee_out = Amount();
    bool use_bnb_out = false;
    std::vector<Utxo> ret_utxos = SelectCoinsMinConf(
        target_value, utxos, filter, option_params, tx_fee, consider_fee,
        &select_value_out, &utxo_fee_out, &use_bnb_out);
    std::copy(ret_utxos.begin(), ret_utxos.end(), std::back_inserter(result));
    tx_fee_out += utxo_fee_out;
    work_utxo_fee += utxo_fee_out;
    work_selected_values.emplace(asset_id, select_value_out);
    work_searched_bnb.emplace(asset_id, use_bnb_out);
    work_map_utxo_fee_value.emplace(asset_id, utxo_fee_out.GetSatoshiValue());
  };

  // do coin selection exclude fee asset
  for (auto& target : work_target_values) {
    // skip fee asset
    if (target.first == fee_asset.GetHex()) {
      continue;
    }

    // For assets other than fees, calculate without considering fees.
    const auto& target_value = target.second;
    coin_selection_function(
        target_value, asset_utxos[target.first], Amount(), target.first,
        false);
  }

  // do coin selection with fee asset
  if (calculate_fee && (!option_params.HasIgnoreFeeAsset())) {
    int64_t target_value = work_target_values[fee_asset.GetHex()];
    coin_selection_function(
        target_value, asset_utxos[fee_asset.GetHex()], tx_fee_out,
        fee_asset.GetHex(), true);
  }

  if (map_select_value != nullptr) {
    *map_select_value = work_selected_values;
  }
  if (utxo_fee_value != nullptr) {
    *utxo_fee_value = work_utxo_fee;
  }
  if (map_searched_bnb != nullptr) {
    *map_searched_bnb = work_searched_bnb;
  }
  if (map_utxo_fee_value != nullptr) {
    *map_utxo_fee_value = work_map_utxo_fee_value;
  }
  return result;
}